

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Solver::flip(Solver *this,int lit)

{
  External *this_00;
  bool bVar1;
  char *__ptr;
  size_t sStack_20;
  
  if ((this->internal != (Internal *)0x0) && (this->trace_api_file != (FILE *)0x0)) {
    trace_api_call(this,"flip",lit);
  }
  require_solver_pointer_to_be_non_zero
            (this,"bool CaDiCaL::Solver::flip(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  this_00 = this->external;
  if (this_00 == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
LAB_00686829:
    sStack_20 = 0x1f;
  }
  else {
    if (this->internal == (Internal *)0x0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "internal solver not initialized";
      goto LAB_00686829;
    }
    if ((this->_state & VALID) == 0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "solver in invalid state";
      sStack_20 = 0x17;
    }
    else {
      if ((lit & 0x7fffffffU) == 0) {
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        fprintf(_stderr,"invalid literal \'%d\'",lit);
        fputc(10,_stderr);
        goto LAB_00686944;
      }
      if (this->_state == SATISFIED) {
        if (this_00->propagator == (ExternalPropagator *)0x0) {
          bVar1 = External::flip(this_00,lit);
          return bVar1;
        }
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        __ptr = "can only flip when no external propagator is present";
        sStack_20 = 0x34;
      }
      else {
        fatal_message_start();
        fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
                "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
               );
        __ptr = "can only flip value in satisfied state";
        sStack_20 = 0x26;
      }
    }
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  fputc(10,_stderr);
LAB_00686944:
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::flip (int lit) {
  TRACE ("flip", lit);
  REQUIRE_VALID_STATE ();
  REQUIRE_VALID_LIT (lit);
  REQUIRE (state () == SATISFIED, "can only flip value in satisfied state");
  REQUIRE (!external->propagator,
           "can only flip when no external propagator is present");
  bool res = external->flip (lit);
  LOG_API_CALL_RETURNS ("flip", lit, res);
  assert (state () == SATISFIED);
  return res;
}